

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.cpp
# Opt level: O0

void __thiscall
TPZTransfer<std::complex<float>_>::MultAddScalar
          (TPZTransfer<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *x,
          TPZFMatrix<std::complex<float>_> *y,TPZFMatrix<std::complex<float>_> *z,
          complex<float> alpha,complex<float> beta,int opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int64_t iVar5;
  int64_t iVar6;
  int *piVar7;
  TPZBaseMatrix *in_RCX;
  TPZBaseMatrix *in_RDX;
  TPZFMatrix<std::complex<float>_> *in_RSI;
  TPZBaseMatrix *in_RDI;
  int in_R8D;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  TPZFMatrix<std::complex<float>_> aloc_1;
  TPZFMatrix<std::complex<float>_> zloc_1;
  int colblocksize_1;
  int colblockpos_1;
  int col_1;
  int numcolbl_1;
  int colpos_1;
  TPZFMatrix<std::complex<float>_> xloc_1;
  int rowblocksize_1;
  int rowblockpos_1;
  TPZFMatrix<std::complex<float>_> aloc;
  TPZFMatrix<std::complex<float>_> xloc;
  int colblocksize;
  int colblockpos;
  int col;
  TPZFMatrix<std::complex<float>_> zloc;
  int numcolbl;
  int colpos;
  int rowblocksize;
  int rowblockpos;
  int r;
  int c;
  int ic;
  int xcols;
  int rows;
  complex<float> *in_stack_fffffffffffffb08;
  TPZBlock *in_stack_fffffffffffffb10;
  TPZVec<std::complex<float>_> *in_stack_fffffffffffffb20;
  int *in_stack_fffffffffffffb28;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffb30;
  undefined8 in_stack_fffffffffffffb50;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffb58;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffb60;
  TPZMatrix<std::complex<float>_> *in_stack_fffffffffffffb68;
  complex<float> in_stack_fffffffffffffb70;
  complex<float> *in_stack_fffffffffffffb78;
  TPZVec<std::complex<float>_> *in_stack_fffffffffffffb80;
  int *in_stack_fffffffffffffb88;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffb90;
  complex<float> local_420;
  undefined8 local_418;
  int in_stack_fffffffffffffc44;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffc48;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffc50;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffc58;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffc60;
  complex<float> in_stack_fffffffffffffc68;
  complex<float> in_stack_fffffffffffffc70;
  char *in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  complex<float> local_240;
  undefined8 local_238;
  int local_10c;
  int local_108;
  int local_f4;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  undefined8 local_50;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  TPZBaseMatrix *local_30;
  TPZBaseMatrix *local_28;
  TPZFMatrix<std::complex<float>_> *local_20;
  undefined8 local_10;
  undefined8 local_8;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffb50 >> 0x20);
  local_34 = in_R8D;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_10 = in_XMM1_Qa;
  local_8 = in_XMM0_Qa;
  if (in_R8D == 0) {
    iVar5 = TPZBaseMatrix::Cols(in_RDI);
    iVar6 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_20);
    if (iVar5 == iVar6) goto LAB_011d3e1d;
LAB_011d3e59:
    TPZMatrix<std::complex<float>_>::Error
              ((char *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
               in_stack_fffffffffffffd08);
  }
  else {
LAB_011d3e1d:
    if (local_34 != 0) {
      iVar5 = TPZBaseMatrix::Rows(in_RDI);
      iVar6 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_20);
      if (iVar5 != iVar6) goto LAB_011d3e59;
    }
  }
  iVar5 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_20);
  iVar6 = TPZBaseMatrix::Cols(local_28);
  if (iVar5 == iVar6) {
    iVar5 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_20);
    iVar6 = TPZBaseMatrix::Cols(local_30);
    if (iVar5 == iVar6) goto LAB_011d3edd;
  }
  TPZMatrix<std::complex<float>_>::Error
            ((char *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
             in_stack_fffffffffffffd08);
LAB_011d3edd:
  local_38 = TPZBlock::MaxBlockSize((TPZBlock *)0x11d3eee);
  iVar5 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_20);
  local_3c = (int)iVar5;
  local_50 = local_10;
  TPZMatrix<std::complex<float>_>::PrepareZ
            (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
             in_stack_fffffffffffffb70,iVar2);
  for (local_40 = 0; local_40 < local_3c; local_40 = local_40 + 1) {
    if (local_34 == 0) {
      for (local_48 = 0; local_48 < local_38; local_48 = local_48 + 1) {
        local_54 = TPZBlock::Position(in_stack_fffffffffffffb10,
                                      (int)((ulong)in_stack_fffffffffffffb08 >> 0x20));
        local_58 = TPZBlock::Size(in_stack_fffffffffffffb10,
                                  (int)((ulong)in_stack_fffffffffffffb08 >> 0x20));
        if (local_58 != 0) {
          piVar7 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0xe),(long)local_48);
          local_5c = *piVar7;
          if (local_5c != -1) {
            piVar7 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0xf),(long)local_48);
            local_60 = *piVar7;
            if (local_60 != 0) {
              TPZFMatrix<std::complex<float>_>::operator()
                        (in_stack_fffffffffffffb30,(int64_t)in_stack_fffffffffffffb28,
                         (int64_t)in_stack_fffffffffffffb20);
              TPZFMatrix<std::complex<float>_>::TPZFMatrix
                        (in_stack_fffffffffffffb90,(int64_t)in_stack_fffffffffffffb88,
                         (int64_t)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                         in_stack_fffffffffffffb70._M_value);
              for (local_44 = 0; local_44 < local_60; local_44 = local_44 + 1) {
                piVar7 = TPZVec<int>::operator[]
                                   ((TPZVec<int> *)&in_RDI[0x12].fRow,(long)(local_5c + local_44));
                local_f4 = *piVar7;
                local_108 = TPZBlock::Position(in_stack_fffffffffffffb10,
                                               (int)((ulong)in_stack_fffffffffffffb08 >> 0x20));
                local_10c = TPZBlock::Size(in_stack_fffffffffffffb10,
                                           (int)((ulong)in_stack_fffffffffffffb08 >> 0x20));
                in_stack_fffffffffffffb90 = (TPZFMatrix<std::complex<float>_> *)(long)local_10c;
                TPZFMatrix<std::complex<float>_>::g(local_20,(long)local_108,(long)local_40);
                TPZFMatrix<std::complex<float>_>::TPZFMatrix
                          (in_stack_fffffffffffffb90,(int64_t)in_stack_fffffffffffffb88,
                           (int64_t)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                           in_stack_fffffffffffffb70._M_value);
                in_stack_fffffffffffffb70._M_value = (_ComplexT)local_58;
                in_stack_fffffffffffffb78 = (complex<float> *)(long)local_10c;
                in_stack_fffffffffffffb80 =
                     (TPZVec<std::complex<float>_> *)&in_RDI[0x14].fDecomposed;
                in_stack_fffffffffffffb88 =
                     TPZVec<int>::operator[]
                               ((TPZVec<int> *)(in_RDI + 0x10),(long)(local_5c + local_44));
                TPZVec<std::complex<float>_>::operator[]
                          (in_stack_fffffffffffffb80,(long)*in_stack_fffffffffffffb88);
                TPZFMatrix<std::complex<float>_>::TPZFMatrix
                          (in_stack_fffffffffffffb90,(int64_t)in_stack_fffffffffffffb88,
                           (int64_t)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                           in_stack_fffffffffffffb70._M_value);
                local_238 = local_8;
                std::complex<float>::complex(&local_240,1.0,0.0);
                TPZFMatrix<std::complex<float>_>::MultAdd
                          (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
                           in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                           in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                           in_stack_fffffffffffffc44);
                TPZFMatrix<std::complex<float>_>::~TPZFMatrix
                          ((TPZFMatrix<std::complex<float>_> *)0x11d42db);
                TPZFMatrix<std::complex<float>_>::~TPZFMatrix
                          ((TPZFMatrix<std::complex<float>_> *)0x11d42e8);
              }
              TPZFMatrix<std::complex<float>_>::~TPZFMatrix
                        ((TPZFMatrix<std::complex<float>_> *)0x11d4367);
            }
          }
        }
      }
    }
    else {
      for (local_48 = 0; local_48 < local_38; local_48 = local_48 + 1) {
        iVar2 = TPZBlock::Position(in_stack_fffffffffffffb10,
                                   (int)((ulong)in_stack_fffffffffffffb08 >> 0x20));
        iVar3 = TPZBlock::Size(in_stack_fffffffffffffb10,
                               (int)((ulong)in_stack_fffffffffffffb08 >> 0x20));
        if (iVar3 != 0) {
          TPZFMatrix<std::complex<float>_>::g(local_20,(long)iVar2,(long)local_40);
          TPZFMatrix<std::complex<float>_>::TPZFMatrix
                    (in_stack_fffffffffffffb90,(int64_t)in_stack_fffffffffffffb88,
                     (int64_t)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                     in_stack_fffffffffffffb70._M_value);
          piVar7 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0xe),(long)local_48);
          iVar2 = *piVar7;
          if (iVar2 != -1) {
            piVar7 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0xf),(long)local_48);
            iVar1 = *piVar7;
            if (iVar1 != 0) {
              for (local_44 = 0; iVar4 = (int)((ulong)in_stack_fffffffffffffb08 >> 0x20),
                  local_44 < iVar1; local_44 = local_44 + 1) {
                TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI[0x12].fRow,(long)(iVar2 + local_44));
                TPZBlock::Position(in_stack_fffffffffffffb10,iVar4);
                iVar4 = TPZBlock::Size(in_stack_fffffffffffffb10,iVar4);
                in_stack_fffffffffffffb30 = (TPZFMatrix<std::complex<float>_> *)(long)iVar4;
                TPZFMatrix<std::complex<float>_>::operator()
                          (in_stack_fffffffffffffb30,(int64_t)in_stack_fffffffffffffb28,
                           (int64_t)in_stack_fffffffffffffb20);
                TPZFMatrix<std::complex<float>_>::TPZFMatrix
                          (in_stack_fffffffffffffb90,(int64_t)in_stack_fffffffffffffb88,
                           (int64_t)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                           in_stack_fffffffffffffb70._M_value);
                in_stack_fffffffffffffb10 = (TPZBlock *)(long)iVar3;
                in_stack_fffffffffffffb20 =
                     (TPZVec<std::complex<float>_> *)&in_RDI[0x14].fDecomposed;
                in_stack_fffffffffffffb28 =
                     TPZVec<int>::operator[]
                               ((TPZVec<int> *)(in_RDI + 0x10),(long)(iVar2 + local_44));
                in_stack_fffffffffffffb08 =
                     TPZVec<std::complex<float>_>::operator[]
                               (in_stack_fffffffffffffb20,(long)*in_stack_fffffffffffffb28);
                TPZFMatrix<std::complex<float>_>::TPZFMatrix
                          (in_stack_fffffffffffffb90,(int64_t)in_stack_fffffffffffffb88,
                           (int64_t)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                           in_stack_fffffffffffffb70._M_value);
                local_418 = local_8;
                std::complex<float>::complex(&local_420,1.0,0.0);
                TPZFMatrix<std::complex<float>_>::MultAdd
                          (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
                           in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                           in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                           in_stack_fffffffffffffc44);
                TPZFMatrix<std::complex<float>_>::~TPZFMatrix
                          ((TPZFMatrix<std::complex<float>_> *)0x11d4739);
                TPZFMatrix<std::complex<float>_>::~TPZFMatrix
                          ((TPZFMatrix<std::complex<float>_> *)0x11d4746);
              }
            }
          }
          TPZFMatrix<std::complex<float>_>::~TPZFMatrix
                    ((TPZFMatrix<std::complex<float>_> *)0x11d47ba);
        }
      }
    }
  }
  return;
}

Assistant:

void TPZTransfer<TVar>::MultAddScalar(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
						  TVar alpha, TVar beta, int opt) const{
	// multiplies the transfer matrix and puts the result in z
	if ((!opt && this->Cols() != x.Rows()) || (opt && this->Rows() != x.Rows()))
		this->Error( "TPZTransfer<TVar>::MultAdd <matrices with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Cols() != z.Cols()) {
		this->Error ("TPZTransfer<TVar>::MultiplyAdd incompatible dimensions\n");
	}
	int rows = fRowBlock.MaxBlockSize();
	int xcols = x.Cols();
	int ic, c, r;
	this->PrepareZ(y,z,beta,opt);
	for (ic = 0; ic < xcols; ic++) {
		if(!opt) {
			for ( r=0; r < rows; r++) {
				int rowblockpos = fRowBlock.Position(r);
				int rowblocksize = fRowBlock.Size(r);
				if(!rowblocksize) continue;
				int colpos = fColPosition[r];
				if(colpos == -1) continue;
				int numcolbl = fNumberofColumnBlocks[r];
				if(numcolbl == 0) continue;
				TPZFMatrix<TVar> zloc(rowblocksize,1,&z(rowblockpos,ic),rowblocksize);
				for( c=0; c < numcolbl; c++) {
					int col = fColumnBlockNumber[colpos+c];
					int colblockpos = fColBlock.Position(col);
					int colblocksize = fColBlock.Size(col);
					TPZFMatrix<TVar> xloc(colblocksize,1,&x.g(colblockpos,ic), colblocksize);
					TPZFMatrix<TVar> aloc(rowblocksize,colblocksize,
									&fDoubleValues[fColumnBlockPosition[colpos+c]],rowblocksize*colblocksize);
					aloc.MultAdd(xloc,zloc,zloc,alpha,1.,opt);
				}
			}
		} else {
			for ( r=0; r < rows; r++) {
				int rowblockpos = fRowBlock.Position(r);
				int rowblocksize = fRowBlock.Size(r);
				if(!rowblocksize) continue;
				TPZFMatrix<TVar> xloc(rowblocksize,1,&x.g(rowblockpos,ic),rowblocksize);
				int colpos = fColPosition[r];
				if(colpos == -1) continue;
				int numcolbl = fNumberofColumnBlocks[r];
				if(numcolbl == 0) continue;
				for( c=0; c < numcolbl; c++) {
					int col = fColumnBlockNumber[colpos+c];
					int colblockpos = fColBlock.Position(col);
					int colblocksize = fColBlock.Size(col);
					TPZFMatrix<TVar> zloc(colblocksize,1,&z(colblockpos,ic),colblocksize);
					TPZFMatrix<TVar> aloc(rowblocksize,colblocksize,
									&fDoubleValues[fColumnBlockPosition[colpos+c]],rowblocksize*colblocksize);
					aloc.MultAdd(xloc,zloc,zloc,alpha,1.,opt);
					col = rowblockpos-1;
					rowblockpos = col+1;
				}
			}
		}
	}
}